

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu3_print.h
# Opt level: O0

int grisu3(double v,char *buffer,int *length,int *d_exp)

{
  int iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  long lVar4;
  grisu3_diy_fp_t gVar5;
  grisu3_diy_fp_t gVar6;
  grisu3_diy_fp_t gVar7;
  grisu3_diy_fp_t x;
  grisu3_diy_fp_t x_00;
  grisu3_diy_fp_t low;
  grisu3_diy_fp_t y;
  grisu3_diy_fp_t y_00;
  grisu3_diy_fp_t y_01;
  grisu3_diy_fp_t w_00;
  grisu3_diy_fp_t high;
  uint64_t u64;
  grisu3_diy_fp_t c_mk;
  grisu3_diy_fp_t b_minus;
  grisu3_diy_fp_t b_plus;
  grisu3_diy_fp_t t;
  grisu3_diy_fp_t w;
  grisu3_diy_fp_t dfp;
  int local_30;
  int success;
  int kappa;
  int mk;
  int *d_exp_local;
  int *length_local;
  char *buffer_local;
  double v_local;
  
  _kappa = d_exp;
  d_exp_local = length;
  length_local = (int *)buffer;
  buffer_local = (char *)v;
  gVar5 = grisu3_cast_diy_fp_from_double(v);
  uVar2 = gVar5.f;
  gVar6._12_4_ = 0;
  gVar6.f = SUB128(gVar5._0_12_,0);
  gVar6.e = SUB124(gVar5._0_12_,8);
  gVar6 = grisu3_diy_fp_normalize(gVar6);
  gVar7.e = gVar5.e + -1;
  gVar7.f = uVar2 * 2 + 1;
  gVar7._12_4_ = 0;
  gVar7 = grisu3_diy_fp_normalize(gVar7);
  uVar3 = grisu3_cast_uint64_from_double((double)buffer_local);
  if ((0.0 < (double)buffer_local) && ((double)buffer_local <= 1.79769313486232e+308)) {
    if (((uVar3 & 0xfffffffffffff) == 0) && ((uVar3 & 0x7ff0000000000000) != 0)) {
      lVar4 = uVar2 * 4;
      b_minus.f._0_1_ = (char)gVar5.e + -2;
    }
    else {
      lVar4 = uVar2 * 2;
      b_minus.f._0_1_ = (char)gVar5.e + -1;
    }
    c_mk._8_8_ = lVar4 + -1;
    c_mk._8_8_ = c_mk._8_8_ << ((char)b_minus.f - (char)gVar7.e & 0x3fU);
    success = grisu3_diy_fp_cached_pow(-0x7c - gVar6.e,(grisu3_diy_fp_t *)&u64);
    gVar5._12_4_ = 0;
    gVar5.f = SUB128(gVar6._0_12_,0);
    gVar5.e = SUB124(gVar6._0_12_,8);
    y._12_4_ = 0;
    y.f = u64;
    y.e = (undefined4)c_mk.f;
    gVar5 = grisu3_diy_fp_multiply(gVar5,y);
    x.e = gVar7.e;
    x.f = c_mk._8_8_;
    x._12_4_ = 0;
    y_00._12_4_ = 0;
    y_00.f = u64;
    y_00.e = (undefined4)c_mk.f;
    gVar6 = grisu3_diy_fp_multiply(x,y_00);
    c_mk._8_8_ = gVar6.f;
    x_00._12_4_ = 0;
    x_00.f = SUB128(gVar7._0_12_,0);
    x_00.e = SUB124(gVar7._0_12_,8);
    y_01._12_4_ = 0;
    y_01.f = u64;
    y_01.e = (undefined4)c_mk.f;
    gVar7 = grisu3_diy_fp_multiply(x_00,y_01);
    low.e = gVar6.e;
    low.f = c_mk._8_8_;
    low._12_4_ = 0;
    w_00._12_4_ = 0;
    w_00.f = SUB128(gVar5._0_12_,0);
    w_00.e = SUB124(gVar5._0_12_,8);
    high._12_4_ = 0;
    high.f = SUB128(gVar7._0_12_,0);
    high.e = SUB124(gVar7._0_12_,8);
    iVar1 = grisu3_digit_gen(low,w_00,high,(char *)length_local,d_exp_local,&local_30);
    *_kappa = local_30 - success;
    return iVar1;
  }
  __assert_fail("v > 0 && v <= 1.7976931348623157e308",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_print.h"
                ,0x8a,"int grisu3(double, char *, int *, int *)");
}

Assistant:

static int grisu3(double v, char *buffer, int *length, int *d_exp)
{
    int mk, kappa, success;
    grisu3_diy_fp_t dfp = grisu3_cast_diy_fp_from_double(v);
    grisu3_diy_fp_t w = grisu3_diy_fp_normalize(dfp);

    /* normalize boundaries */
    grisu3_diy_fp_t t = { (dfp.f << 1) + 1, dfp.e - 1 };
    grisu3_diy_fp_t b_plus = grisu3_diy_fp_normalize(t);
    grisu3_diy_fp_t b_minus;
    grisu3_diy_fp_t c_mk; /* Cached power of ten: 10^-k */
    uint64_t u64 = grisu3_cast_uint64_from_double(v);
    assert(v > 0 && v <= 1.7976931348623157e308); /* Grisu only handles strictly positive finite numbers. */
    if (!(u64 & GRISU3_D64_FRACT_MASK) && (u64 & GRISU3_D64_EXP_MASK) != 0) { b_minus.f = (dfp.f << 2) - 1; b_minus.e =  dfp.e - 2;} /* lower boundary is closer? */
    else { b_minus.f = (dfp.f << 1) - 1; b_minus.e = dfp.e - 1; }
    b_minus.f = b_minus.f << (b_minus.e - b_plus.e);
    b_minus.e = b_plus.e;

    mk = grisu3_diy_fp_cached_pow(GRISU3_MIN_TARGET_EXP - GRISU3_DIY_FP_FRACT_SIZE - w.e, &c_mk);

    w = grisu3_diy_fp_multiply(w, c_mk);
    b_minus = grisu3_diy_fp_multiply(b_minus, c_mk);
    b_plus  = grisu3_diy_fp_multiply(b_plus,  c_mk);

    success = grisu3_digit_gen(b_minus, w, b_plus, buffer, length, &kappa);
    *d_exp = kappa - mk;
    return success;
}